

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

SDL_bool Surface20to12InPlace(SDL_Surface *surface20,SDL12_Surface *surface12)

{
  byte *pbVar1;
  uint uVar2;
  SDL_Palette *pSVar3;
  SDL_PixelFormat *pSVar4;
  int iVar5;
  SDL12_Palette *pSVar6;
  SDL12_PixelFormat *pSVar7;
  Uint16 UVar8;
  SDL_BlendMode blendmode;
  SDL_BlendMode local_2c;
  
  local_2c = SDL_BLENDMODE_NONE;
  if (surface20 == (SDL_Surface *)0x0) {
    return SDL_FALSE;
  }
  if (0xffff < surface20->pitch) {
    (*SDL20_SetError)("Pitch is too large");
    return SDL_FALSE;
  }
  if (surface20->format->palette == (SDL_Palette *)0x0) {
    pSVar6 = (SDL12_Palette *)0x0;
  }
  else {
    pSVar6 = (SDL12_Palette *)(*SDL20_malloc)(0x10);
    if (pSVar6 == (SDL12_Palette *)0x0) {
      pSVar6 = (SDL12_Palette *)0x0;
      goto LAB_00115247;
    }
  }
  pSVar7 = (SDL12_PixelFormat *)(*SDL20_malloc)(0x30);
  if (pSVar7 != (SDL12_PixelFormat *)0x0) {
    if (pSVar6 != (SDL12_Palette *)0x0) {
      (*SDL20_memset)(pSVar6,0,0x10);
      pSVar3 = surface20->format->palette;
      pSVar6->ncolors = pSVar3->ncolors;
      pSVar6->colors = pSVar3->colors;
    }
    (*SDL20_memset)(pSVar7,0,0x30);
    pSVar7->palette = pSVar6;
    pSVar4 = surface20->format;
    pSVar7->BitsPerPixel = pSVar4->BitsPerPixel;
    pSVar7->BytesPerPixel = pSVar4->BytesPerPixel;
    pSVar7->Rloss = pSVar4->Rloss;
    pSVar7->Gloss = pSVar4->Gloss;
    pSVar7->Bloss = pSVar4->Bloss;
    pSVar7->Aloss = pSVar4->Aloss;
    pSVar7->Rshift = pSVar4->Rshift;
    pSVar7->Gshift = pSVar4->Gshift;
    pSVar7->Bshift = pSVar4->Bshift;
    pSVar7->Ashift = pSVar4->Ashift;
    pSVar7->Rmask = pSVar4->Rmask;
    pSVar7->Gmask = pSVar4->Gmask;
    pSVar7->Bmask = pSVar4->Bmask;
    pSVar7->Amask = pSVar4->Amask;
    iVar5 = (*SDL20_GetColorKey)(surface20,&pSVar7->colorkey);
    if (iVar5 < 0) {
      pSVar7->colorkey = 0;
    }
    else {
      pbVar1 = (byte *)((long)&surface12->flags + 1);
      *pbVar1 = *pbVar1 | 0x10;
    }
    iVar5 = (*SDL20_GetSurfaceAlphaMod)(surface20,&pSVar7->alpha);
    if (iVar5 < 0) {
      pSVar7->alpha = 0xff;
    }
    (*SDL20_memset)(surface12,0,0x58);
    uVar2 = surface20->flags;
    if ((uVar2 & 1) != 0) {
      pbVar1 = (byte *)((long)&surface12->flags + 3);
      *pbVar1 = *pbVar1 | 1;
    }
    if ((uVar2 & 2) != 0) {
      pbVar1 = (byte *)((long)&surface12->flags + 1);
      *pbVar1 = *pbVar1 | 0x40;
    }
    iVar5 = (*SDL20_GetSurfaceBlendMode)(surface20,&local_2c);
    if ((iVar5 == 0) && (local_2c == SDL_BLENDMODE_BLEND)) {
      pbVar1 = (byte *)((long)&surface12->flags + 2);
      *pbVar1 = *pbVar1 | 1;
    }
    surface12->format = pSVar7;
    surface12->w = surface20->w;
    surface12->h = surface20->h;
    surface12->pitch = (Uint16)surface20->pitch;
    surface12->pixels = surface20->pixels;
    surface12->offset = 0;
    surface12->surface20 = surface20;
    (surface12->clip_rect).x = (Sint16)(surface20->clip_rect).x;
    (surface12->clip_rect).y = (Sint16)(surface20->clip_rect).y;
    iVar5 = (surface20->clip_rect).w;
    UVar8 = (Uint16)iVar5;
    if (iVar5 < 1) {
      UVar8 = 0;
    }
    (surface12->clip_rect).w = UVar8;
    iVar5 = (surface20->clip_rect).h;
    UVar8 = (Uint16)iVar5;
    if (iVar5 < 1) {
      UVar8 = 0;
    }
    (surface12->clip_rect).h = UVar8;
    surface12->refcount = surface20->refcount;
    return SDL_TRUE;
  }
LAB_00115247:
  (*SDL20_free)(pSVar6);
  (*SDL20_free)((void *)0x0);
  return SDL_FALSE;
}

Assistant:

static SDL_bool
Surface20to12InPlace(SDL_Surface *surface20,
                     SDL12_Surface *surface12)
{
    SDL_BlendMode blendmode = SDL_BLENDMODE_NONE;
    SDL12_Palette *palette12 = NULL;
    SDL12_PixelFormat *format12 = NULL;
    Uint32 flags = 0;

    if (!surface20) {
        return SDL_FALSE;
    }
    if (surface20->pitch > 65535) {
        SDL20_SetError("Pitch is too large");  /* can't fit to 16-bits */
        return SDL_FALSE;
    }

    if (surface20->format->palette) {
        palette12 = (SDL12_Palette *) SDL20_malloc(sizeof (SDL12_Palette));
        if (!palette12) {
            goto failed;
        }
    }

    format12 = (SDL12_PixelFormat *) SDL20_malloc(sizeof (SDL12_PixelFormat));
    if (!format12) {
        goto failed;
    }

    if (palette12) {
        SDL20_zerop(palette12);
        SDL_assert(surface20->format->palette);
        palette12->ncolors = surface20->format->palette->ncolors;
        palette12->colors = surface20->format->palette->colors;
    }

    SDL20_zerop(format12);
    format12->palette = palette12;
    format12->BitsPerPixel = surface20->format->BitsPerPixel;
    format12->BytesPerPixel = surface20->format->BytesPerPixel;
    format12->Rloss = surface20->format->Rloss;
    format12->Gloss = surface20->format->Gloss;
    format12->Bloss = surface20->format->Bloss;
    format12->Aloss = surface20->format->Aloss;
    format12->Rshift = surface20->format->Rshift;
    format12->Gshift = surface20->format->Gshift;
    format12->Bshift = surface20->format->Bshift;
    format12->Ashift = surface20->format->Ashift;
    format12->Rmask = surface20->format->Rmask;
    format12->Gmask = surface20->format->Gmask;
    format12->Bmask = surface20->format->Bmask;
    format12->Amask = surface20->format->Amask;

    if (SDL20_GetColorKey(surface20, &format12->colorkey) < 0) {
        format12->colorkey = 0;
    } else {
        surface12->flags |= SDL12_SRCCOLORKEY;
    }

    if (SDL20_GetSurfaceAlphaMod(surface20, &format12->alpha) < 0) {
        format12->alpha = 255;
    }

    SDL20_zerop(surface12);
    flags = surface20->flags;
    flags &= ~SDL_SIMD_ALIGNED;  /* we don't need to map this to 1.2 */
    #define MAPSURFACEFLAGS(fl) { if (surface20->flags & SDL_##fl) { surface12->flags |= SDL12_##fl; flags &= ~SDL_##fl; } }
    MAPSURFACEFLAGS(PREALLOC);
    MAPSURFACEFLAGS(RLEACCEL);
    /*MAPSURFACEFLAGS(DONTFREE);*/
    #undef MAPSURFACEFLAGS
    SDL_assert(flags == 0);  /* non-zero if there's a flag we didn't map. */

    if ((SDL20_GetSurfaceBlendMode(surface20, &blendmode) == 0) && (blendmode == SDL_BLENDMODE_BLEND)) {
        surface12->flags |= SDL12_SRCALPHA;
    }

    surface12->format = format12;
    surface12->w = surface20->w;
    surface12->h = surface20->h;
    surface12->pitch = (Uint16) surface20->pitch;
    surface12->pixels = surface20->pixels;
    surface12->offset = 0;
    surface12->surface20 = surface20;
    Rect20to12(&surface20->clip_rect, &surface12->clip_rect);
    surface12->refcount = surface20->refcount;

    return SDL_TRUE;

failed:
    SDL20_free(palette12);
    SDL20_free(format12);
    return SDL_FALSE;
}